

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall
PDA::Transducer::Generator::writeFunctionBody
          (Generator *this,wostream *stream,size_t startTokenIndex)

{
  int iVar1;
  pointer pTVar2;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *pvVar3;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *pvVar4;
  byte bVar5;
  long lVar6;
  size_t i;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> currentOp;
  
  pvVar3 = Tokenizer::tokens(this->m_tokenizer);
  currentOp.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currentOp.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  currentOp.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar6 = startTokenIndex * 0x14;
  bVar5 = 0;
  while( true ) {
    pvVar4 = Tokenizer::tokens(this->m_tokenizer);
    if (startTokenIndex ==
        ((long)(pvVar4->
               super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>).
               _M_impl.super__Vector_impl_data._M_finish -
        (long)(pvVar4->
              super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>).
              _M_impl.super__Vector_impl_data._M_start) / 0x14) break;
    pTVar2 = (pvVar3->
             super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>).
             _M_impl.super__Vector_impl_data._M_start;
    iVar1 = *(int *)((long)&pTVar2->token + lVar6);
    if ((bool)(~bVar5 & 1 | iVar1 == 0x76)) {
      bVar5 = bVar5 | iVar1 == 0x76;
    }
    else if (iVar1 == 0x3b) {
      if (currentOp.
          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          currentOp.
          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        writeAssembledOperation(this,stream,&currentOp);
        if (currentOp.
            super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            currentOp.
            super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          currentOp.
          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               currentOp.
               super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
      }
    }
    else {
      if (iVar1 == 0x7d) break;
      std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::push_back
                (&currentOp,(value_type *)((long)&pTVar2->token + lVar6));
    }
    startTokenIndex = startTokenIndex + 1;
    lVar6 = lVar6 + 0x14;
  }
  if (currentOp.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      currentOp.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    writeAssembledOperation(this,stream,&currentOp);
  }
  std::_Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::~_Vector_base
            (&currentOp.
              super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>);
  return;
}

Assistant:

void Generator::writeFunctionBody(std::wostream &stream, const size_t startTokenIndex)
{
    bool started = false;
    const std::vector<Token> &tokens = m_tokenizer.tokens();
    std::vector<Token> currentOp;
    for(size_t i = startTokenIndex; i != m_tokenizer.tokens().size(); ++i)
    {
        if (tokens[i].token == L'v')
        {
            started = true;
            continue;
        }
        if (!started)
            continue;
        //checking for end
        if (tokens[i].token == L'}')
            break;
        // splitting
        if (tokens[i].token == L';')
        {
            if (!currentOp.empty())
            {
                writeAssembledOperation(stream, currentOp);
                currentOp.clear();
            }
        }
        else
            currentOp.push_back(tokens[i]);
    }
    if (!currentOp.empty())
        writeAssembledOperation(stream, currentOp);
}